

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

FrameBuffer *
pbrt::imageToFrameBuffer
          (FrameBuffer *__return_storage_ptr__,Image *image,ImageChannelDesc *desc,Box2i *dataWindow
          )

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar5;
  long lVar6;
  size_t sVar7;
  pointer pbVar8;
  int iVar9;
  void *pvVar10;
  ulong uVar11;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar12;
  ulong uVar13;
  long lVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  channelNames;
  Slice local_68 [56];
  
  sVar7 = (image->channelNames).nStored;
  iVar9 = TexelBytes(image->format);
  iVar2 = (image->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  pvVar10 = Image::RawPointer(image,(Point2i)0x0);
  p_Var1 = &(__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header;
  iVar3 = (dataWindow->min).x;
  iVar4 = (dataWindow->min).y;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Image::ChannelNames_abi_cxx11_(&channelNames,image);
  uVar11 = (ulong)(iVar9 * (int)sVar7);
  uVar13 = (long)iVar2 * uVar11;
  lVar6 = -((long)iVar4 * uVar13) - (long)iVar3 * uVar11;
  if (image->format == Half) {
    paVar5 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
              *)(desc->offset).ptr;
    sVar7 = (desc->offset).nStored;
    paVar12 = &(desc->offset).field_2;
    if (paVar5 != (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                   *)0x0) {
      paVar12 = paVar5;
    }
    for (lVar14 = 0;
        pbVar8 = channelNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, sVar7 << 2 != lVar14;
        lVar14 = lVar14 + 4) {
      iVar2 = *(int *)((long)paVar12 + lVar14);
      Imf_2_5::Slice::Slice
                (local_68,HALF,(char *)((long)pvVar10 + (long)iVar2 * 2 + lVar6),uVar11,uVar13,1,1,
                 0.0,false,false);
      Imf_2_5::FrameBuffer::insert((string *)__return_storage_ptr__,(Slice *)(pbVar8 + iVar2));
    }
  }
  else {
    if (image->format != Float) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
               ,0x3c9,"Unexpected image format");
    }
    paVar5 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
              *)(desc->offset).ptr;
    sVar7 = (desc->offset).nStored;
    paVar12 = &(desc->offset).field_2;
    if (paVar5 != (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                   *)0x0) {
      paVar12 = paVar5;
    }
    for (lVar14 = 0;
        pbVar8 = channelNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, sVar7 << 2 != lVar14;
        lVar14 = lVar14 + 4) {
      iVar2 = *(int *)((long)paVar12 + lVar14);
      Imf_2_5::Slice::Slice
                (local_68,FLOAT,(char *)((long)pvVar10 + (long)iVar2 * 4 + lVar6),uVar11,uVar13,1,1,
                 0.0,false,false);
      Imf_2_5::FrameBuffer::insert((string *)__return_storage_ptr__,(Slice *)(pbVar8 + iVar2));
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&channelNames);
  return __return_storage_ptr__;
}

Assistant:

static Imf::FrameBuffer imageToFrameBuffer(const Image &image,
                                           const ImageChannelDesc &desc,
                                           const Imath::Box2i &dataWindow) {
    size_t xStride = image.NChannels() * TexelBytes(image.Format());
    size_t yStride = image.Resolution().x * xStride;
    // Would be nice to use PixelOffset(-dw.min.x, -dw.min.y) but
    // it checks to make sure the coordiantes are >= 0 (which
    // usually makes sense...)
    char *originPtr = (((char *)image.RawPointer({0, 0})) - dataWindow.min.x * xStride -
                       dataWindow.min.y * yStride);

    Imf::FrameBuffer fb;
    std::vector<std::string> channelNames = image.ChannelNames();
    switch (image.Format()) {
    case PixelFormat::Half:
        for (int channelIndex : desc.offset)
            fb.insert(channelNames[channelIndex],
                      Imf::Slice(Imf::HALF, originPtr + channelIndex * sizeof(Half),
                                 xStride, yStride));
        break;
    case PixelFormat::Float:
        for (int channelIndex : desc.offset)
            fb.insert(channelNames[channelIndex],
                      Imf::Slice(Imf::FLOAT, originPtr + channelIndex * sizeof(float),
                                 xStride, yStride));
        break;
    default:
        LOG_FATAL("Unexpected image format");
    }
    return fb;
}